

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool exists_dir(char *path)

{
  int iVar1;
  char *in_RDI;
  stat sb;
  char temp3 [260];
  char *base;
  char temp [260];
  size_t len;
  uint in_stack_fffffffffffffd50;
  __uid_t in_stack_fffffffffffffd54;
  char *in_stack_fffffffffffffd58;
  char local_238 [264];
  undefined8 local_130;
  char local_128 [272];
  size_t local_18;
  char *local_10;
  _Bool local_1;
  
  local_10 = in_RDI;
  local_18 = strlen(in_RDI);
  if (local_18 == 0) {
    local_1 = false;
  }
  else {
    if ((local_10[local_18 - 1] == *G_BACKSLASH_CHAR) ||
       (local_10[local_18 - 1] == *G_FORWARD_SLASH_CHAR)) {
      strcpy(local_128,local_10);
      local_130 = point_basename((char *)CONCAT44(in_stack_fffffffffffffd54,
                                                  in_stack_fffffffffffffd50));
      if (*local_130 == '\0') {
        local_128[local_18 - 1] = '\0';
        local_10 = local_128;
      }
    }
    normalize_forward_slash
              (in_stack_fffffffffffffd58,
               (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    iVar1 = stat(local_238,(stat *)&stack0xfffffffffffffd38);
    if (iVar1 == -1) {
      local_1 = false;
    }
    else if ((in_stack_fffffffffffffd50 & 0xf000) == 0x4000) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool exists_dir(const char *path)
{
	size_t len = strlen(path);
	if (len == 0)
	{
		return false;
	}
	if ((path[len - 1] == *G_BACKSLASH_CHAR) || (path[len - 1] == *G_FORWARD_SLASH_CHAR))
	{
		char temp[MAX_PATH];
		strcpy(temp, path);
		char *base = point_basename(temp);
		if (*base == '\0')
		{
			temp[len - 1] = '\0';
			path = temp;
		}
	}
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	char16_t temp2[MAX_PATH];
	if (u8tou16_path(path, temp2) == NULL)
	{
		return false;
	}
	if (PathFileExistsW(temp2) == false)
	{
		return false;
	}
	return PathIsDirectoryW(temp2);
#elif defined(__MINGW32__)
	char temp4[MAX_PATH];
	char *res = u8tosjis_path(path, temp4);
	if (res == NULL)
	{
		return false;
	}
	struct stat sb;
	if (stat(temp4, &sb) == -1)
	{
		return false;
	}
	if (S_ISDIR(sb.st_mode))
	{
		return true;
	}
	return false;
#else
	char temp3[MAX_PATH];
	normalize_forward_slash(path, temp3);
	struct stat sb;
	if (stat(temp3, &sb) == -1)
	{
		return false;
	}
	if (S_ISDIR(sb.st_mode))
	{
		return true;
	}
	return false;
#endif
}